

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqlite_kv_delete(unqlite *pDb,void *pKey,int nKeyLen)

{
  unqlite_kv_methods *puVar1;
  unqlite_kv_cursor *puVar2;
  unqlite_kv_engine *puVar3;
  int local_44;
  int rc;
  unqlite_kv_cursor *pCur;
  unqlite_kv_engine *pEngine;
  unqlite_kv_methods *pMethods;
  int nKeyLen_local;
  void *pKey_local;
  unqlite *pDb_local;
  
  if ((pDb == (unqlite *)0x0) || (pDb->nMagic != 0xdb7c2712)) {
    pDb_local._4_4_ = -0x18;
  }
  else {
    puVar3 = unqlitePagerGetKvEngine(pDb);
    puVar1 = puVar3->pIo->pMethods;
    puVar2 = (pDb->sDB).pCursor;
    if (puVar1->xDelete == (_func_int_unqlite_kv_cursor_ptr *)0x0) {
      unqliteGenError(pDb,"xDelete() method not implemented in the underlying storage engine");
      local_44 = -0x11;
    }
    else {
      pMethods._4_4_ = nKeyLen;
      if (nKeyLen < 0) {
        pMethods._4_4_ = SyStrlen((char *)pKey);
      }
      if (pMethods._4_4_ == 0) {
        unqliteGenError(pDb,"Empty key");
        local_44 = -3;
      }
      else {
        local_44 = (*puVar1->xSeek)(puVar2,pKey,pMethods._4_4_,1);
      }
      if (local_44 == 0) {
        local_44 = (*puVar1->xDelete)(puVar2);
      }
    }
    pDb_local._4_4_ = local_44;
  }
  return pDb_local._4_4_;
}

Assistant:

int unqlite_kv_delete(unqlite *pDb,const void *pKey,int nKeyLen)
{
	unqlite_kv_methods *pMethods;
	unqlite_kv_engine *pEngine;
	unqlite_kv_cursor *pCur;
	int rc;
	if( UNQLITE_DB_MISUSE(pDb) ){
		return UNQLITE_CORRUPT;
	}
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Acquire DB mutex */
	 SyMutexEnter(sUnqlMPGlobal.pMutexMethods, pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
	 if( sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE && 
		 UNQLITE_THRD_DB_RELEASE(pDb) ){
			 return UNQLITE_ABORT; /* Another thread have released this instance */
	 }
#endif
	 /* Point to the underlying storage engine */
	 pEngine = unqlitePagerGetKvEngine(pDb);
	 pMethods = pEngine->pIo->pMethods;
	 pCur = pDb->sDB.pCursor;
	 if( pMethods->xDelete == 0 ){
		 /* Storage engine does not implement such method */
		 unqliteGenError(pDb,"xDelete() method not implemented in the underlying storage engine");
		 rc = UNQLITE_NOTIMPLEMENTED;
	 }else{
		 if( nKeyLen < 0 ){
			 /* Assume a null terminated string and compute it's length */
			 nKeyLen = SyStrlen((const char *)pKey);
		 }
		 if( !nKeyLen ){
			 unqliteGenError(pDb,"Empty key");
			 rc = UNQLITE_EMPTY;
		 }else{
			 /* Seek to the record position */
			 rc = pMethods->xSeek(pCur,pKey,nKeyLen,UNQLITE_CURSOR_MATCH_EXACT);
		 }
		 if( rc == UNQLITE_OK ){
			 /* Exact match found, delete the entry */
			 rc = pMethods->xDelete(pCur);
		 }
	 }
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Leave DB mutex */
	 SyMutexLeave(sUnqlMPGlobal.pMutexMethods,pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
#endif
	return rc;
}